

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O0

bool mahjong::enum_discard_tile_1
               (hand_tiles_t *hand_tiles,tile_t discard_tile,uint8_t form_flag,void *context,
               enum_callback_t enum_callback)

{
  ulong uVar1;
  tile_t local_80 [4];
  int local_7c;
  enum_result_t result;
  enum_callback_t enum_callback_local;
  void *context_local;
  uint8_t form_flag_local;
  tile_t discard_tile_local;
  hand_tiles_t *hand_tiles_local;
  
  local_80[1] = 1;
  local_80[0] = discard_tile;
  result.useful_table._64_8_ = enum_callback;
  local_7c = basic_form_shanten(hand_tiles->standing_tiles,hand_tiles->tile_count,
                                (useful_table_t *)&result);
  if ((local_7c == 0) && ((result.useful_table[(ulong)discard_tile - 8] & 1U) != 0)) {
    local_7c = -1;
  }
  uVar1 = (*(code *)result.useful_table._64_8_)(context,local_80);
  if ((uVar1 & 1) == 0) {
    hand_tiles_local._7_1_ = false;
  }
  else {
    if (hand_tiles->tile_count == 0xd) {
      if ((form_flag | 2) != 0) {
        local_80[1] = 2;
        local_7c = seven_pairs_shanten(hand_tiles->standing_tiles,hand_tiles->tile_count,
                                       (useful_table_t *)&result);
        if ((local_7c == 0) && ((result.useful_table[(ulong)discard_tile - 8] & 1U) != 0)) {
          local_7c = -1;
        }
        uVar1 = (*(code *)result.useful_table._64_8_)(context,local_80);
        if ((uVar1 & 1) == 0) {
          return false;
        }
      }
      if ((form_flag | 4) != 0) {
        local_80[1] = 4;
        local_7c = thirteen_orphans_shanten
                             (hand_tiles->standing_tiles,hand_tiles->tile_count,
                              (useful_table_t *)&result);
        if ((local_7c == 0) && ((result.useful_table[(ulong)discard_tile - 8] & 1U) != 0)) {
          local_7c = -1;
        }
        uVar1 = (*(code *)result.useful_table._64_8_)(context,local_80);
        if ((uVar1 & 1) == 0) {
          return false;
        }
      }
      if ((form_flag | 8) != 0) {
        local_80[1] = 8;
        local_7c = honors_and_knitted_tiles_shanten
                             (hand_tiles->standing_tiles,hand_tiles->tile_count,
                              (useful_table_t *)&result);
        if ((local_7c == 0) && ((result.useful_table[(ulong)discard_tile - 8] & 1U) != 0)) {
          local_7c = -1;
        }
        uVar1 = (*(code *)result.useful_table._64_8_)(context,local_80);
        if ((uVar1 & 1) == 0) {
          return false;
        }
      }
    }
    if (((hand_tiles->tile_count == 0xd) || (hand_tiles->tile_count == 10)) &&
       ((form_flag | 0x10) != 0)) {
      local_80[1] = 0x10;
      local_7c = knitted_straight_shanten
                           (hand_tiles->standing_tiles,hand_tiles->tile_count,
                            (useful_table_t *)&result);
      if ((local_7c == 0) && ((result.useful_table[(ulong)discard_tile - 8] & 1U) != 0)) {
        local_7c = -1;
      }
      uVar1 = (*(code *)result.useful_table._64_8_)(context,local_80);
      if ((uVar1 & 1) == 0) {
        return false;
      }
    }
    hand_tiles_local._7_1_ = true;
  }
  return hand_tiles_local._7_1_;
}

Assistant:

static bool enum_discard_tile_1(const hand_tiles_t *hand_tiles, tile_t discard_tile, uint8_t form_flag,
    void *context, enum_callback_t enum_callback) {
    enum_result_t result;
    result.discard_tile = discard_tile;
    result.form_flag = FORM_FLAG_BASIC_FORM;
    result.shanten = basic_form_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
    if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
        result.shanten = -1;
    }
    if (!enum_callback(context, &result)) {
        return false;
    }

    // 立牌有13张时，才需要计算特殊和型
    if (hand_tiles->tile_count == 13) {
        if (form_flag | FORM_FLAG_SEVEN_PAIRS) {
            result.form_flag = FORM_FLAG_SEVEN_PAIRS;
            result.shanten = seven_pairs_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
            if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
                result.shanten = -1;
            }
            if (!enum_callback(context, &result)) {
                return false;
            }
        }

        if (form_flag | FORM_FLAG_THIRTEEN_ORPHANS) {
            result.form_flag = FORM_FLAG_THIRTEEN_ORPHANS;
            result.shanten = thirteen_orphans_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
            if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
                result.shanten = -1;
            }
            if (!enum_callback(context, &result)) {
                return false;
            }
        }

        if (form_flag | FORM_FLAG_HONORS_AND_KNITTED_TILES) {
            result.form_flag = FORM_FLAG_HONORS_AND_KNITTED_TILES;
            result.shanten = honors_and_knitted_tiles_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
            if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
                result.shanten = -1;
            }
            if (!enum_callback(context, &result)) {
                return false;
            }
        }
    }

    // 立牌有13张或者10张时，才需要计算组合龙
    if (hand_tiles->tile_count == 13 || hand_tiles->tile_count == 10) {
        if (form_flag | FORM_FLAG_KNITTED_STRAIGHT) {
            result.form_flag = FORM_FLAG_KNITTED_STRAIGHT;
            result.shanten = knitted_straight_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
            if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
                result.shanten = -1;
            }
            if (!enum_callback(context, &result)) {
                return false;
            }
        }
    }

    return true;
}